

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mygetopt.c
# Opt level: O2

int util_getopt(int argc,char **argv,char *optstring)

{
  uint uVar1;
  char cVar2;
  ushort **ppuVar3;
  char *pcVar4;
  long lVar5;
  int iVar6;
  char *pcVar7;
  uint __c;
  
  iVar6 = util_optind;
  if (optstring == (char *)0x0) {
    return -1;
  }
  if (argv == (char **)0x0) {
    return -1;
  }
  if (argc <= util_optind) {
    return -1;
  }
  lVar5 = (long)util_optind;
  if (util_getopt::arg == (char *)0x0) {
    pcVar4 = argv[lVar5];
    if (pcVar4 == (char *)0x0) {
      return -1;
    }
    if (*pcVar4 != '-') {
      return -1;
    }
    cVar2 = pcVar4[1];
    if (cVar2 == '\0') {
      return -1;
    }
    pcVar7 = pcVar4 + 1;
    if ((cVar2 == '-') && (pcVar4[2] == '\0')) {
      __c = 0xffffffff;
      goto LAB_0010539f;
    }
  }
  else {
    cVar2 = *util_getopt::arg;
    pcVar7 = util_getopt::arg;
  }
  pcVar7 = pcVar7 + 1;
  __c = (uint)cVar2;
  util_optopt = __c;
  util_getopt::arg = pcVar7;
  ppuVar3 = __ctype_b_loc();
  if ((((*ppuVar3)[cVar2] & 8) == 0) || (pcVar4 = strchr(optstring,__c), pcVar4 == (char *)0x0)) {
    uVar1 = 0x3f;
    if ((util_opterr != 0) && (*optstring != ':')) {
      fprintf(_stderr,"%s: Unrecognized option: \'-%c\'\n",*argv,(ulong)__c);
    }
  }
  else {
    uVar1 = __c;
    if (pcVar4[1] == ':') {
      if (*pcVar7 != '\0') {
        util_getopt::arg = (char *)0x0;
        util_optarg = pcVar7;
        goto LAB_0010539f;
      }
      util_optind = iVar6 + 1;
      util_optarg = argv[lVar5 + 1];
      if (util_optarg != (char *)0x0) goto LAB_0010537c;
      cVar2 = *optstring;
      if (util_opterr == 0) {
LAB_001053ec:
        if (cVar2 != ':') {
          uVar1 = 0x3f;
          goto LAB_0010537c;
        }
      }
      else if (cVar2 != ':') {
        fprintf(_stderr,"%s: Option -%c requires an operand\n",*argv,(ulong)__c);
        cVar2 = *optstring;
        goto LAB_001053ec;
      }
      uVar1 = 0x3a;
    }
  }
LAB_0010537c:
  __c = uVar1;
  if (util_getopt::arg == (char *)0x0) {
    return __c;
  }
  if (*util_getopt::arg != '\0') {
    return __c;
  }
  util_getopt::arg = (char *)0x0;
  iVar6 = util_optind;
LAB_0010539f:
  util_optind = iVar6 + 1;
  return __c;
}

Assistant:

int getopt(int argc, char *const argv[], const char *optstring) {
    static char* arg = NULL;
    char*p;
    int rv;
    if(optind >= argc || !argv || !optstring) return -1;
    if(arg == NULL) {
        char *temp = argv[optind];
        if(temp == NULL) return -1;
        if(temp[0] != '-') return -1;
        if(temp[1] == '\0') return -1;
        if(temp[1] == '-' && temp[2] == '\0') { optind++; return -1; }
        arg = temp+1;
    }
    
    optopt = *arg++;
    if(isalnum(optopt) && (p=strchr(optstring,optopt))) {
        rv = optopt;
        if(p[1] == ':') {
            if(*arg) {
                /* argument of form -ffilename */
                optarg = arg;
                arg = NULL;
                optind++;
            }
            else {
                /* argument of form -f filename */
                optarg = argv[++optind]; /* optind will be increased second time later */
                if(!optarg) {
                    if(opterr && optstring[0] != ':')
                        fprintf(stderr, "%s: Option -%c requires an operand\n", argv[0], optopt);
                    rv = optstring[0] == ':' ? ':' : '?';
                }
            }
        }
    }
    else {
        if(opterr && optstring[0] != ':')
            fprintf(stderr, "%s: Unrecognized option: '-%c'\n", argv[0], optopt);
        rv = '?';
    }

    if(arg && *arg == '\0') {
        arg = NULL;
        optind++;
    }

    return rv;
}